

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ListBoxHeader(char *label,int items_count,int height_in_items)

{
  bool bVar1;
  float fVar2;
  int local_30;
  ImVec2 local_2c;
  ImVec2 size;
  float height_in_items_f;
  ImGuiContext *g;
  int height_in_items_local;
  int items_count_local;
  char *label_local;
  
  stack0xffffffffffffffe0 = GImGui;
  local_30 = height_in_items;
  if (height_in_items < 0) {
    local_30 = ImMin<int>(items_count,7);
  }
  size.x = (float)local_30 + 0.25;
  ImVec2::ImVec2(&local_2c);
  local_2c.x = 0.0;
  fVar2 = GetTextLineHeightWithSpacing();
  local_2c.y = fVar2 * size.x + (stack0xffffffffffffffe0->Style).FramePadding.y * 2.0;
  bVar1 = BeginListBox(label,&local_2c);
  return bVar1;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, int items_count, int height_in_items)
{
    // If height_in_items == -1, default height is maximum 7.
    ImGuiContext& g = *GImGui;
    float height_in_items_f = (height_in_items < 0 ? ImMin(items_count, 7) : height_in_items) + 0.25f;
    ImVec2 size;
    size.x = 0.0f;
    size.y = GetTextLineHeightWithSpacing() * height_in_items_f + g.Style.FramePadding.y * 2.0f;
    return BeginListBox(label, size);
}